

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
exr_attr_list_add_static_name
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_type_t type,
          int32_t data_len,uint8_t **data_ptr,exr_attribute_t **attr)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int in_ECX;
  char *in_RDX;
  size_t in_RSI;
  exr_attribute_t **in_RDI;
  undefined4 in_R8D;
  exr_attribute_list_t *in_R9;
  long *in_stack_00000008;
  int32_t in_stack_00000010;
  char *in_stack_00000018;
  exr_attribute_t *nattr;
  size_t slen;
  int32_t mlen;
  int32_t tidx;
  int32_t nlen;
  int rval;
  _internal_exr_attr_map *known;
  exr_attribute_t **in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  undefined8 *puVar6;
  exr_attribute_list_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  exr_attribute_t *nattr_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar7;
  
  puVar6 = (undefined8 *)0x0;
  if (in_RDI == (exr_attribute_t **)0x0) {
    eVar7 = 2;
  }
  else {
    eVar7 = validate_attr_arguments
                      ((exr_context_t)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,(char *)0x0,in_stack_ffffffffffffffa4,
                       (uint8_t **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90);
    if (eVar7 == 0) {
      uVar2 = (uint)*(byte *)((long)in_RDI + 2);
      sVar4 = strlen(in_RDX);
      if ((ulong)(long)(int)uVar2 < sVar4) {
        eVar7 = (*(code *)in_RDI[9])
                          (in_RDI,0xc,"Provided name \'%s\' too long for file (len %d, max %d)",
                           in_RDX,sVar4 & 0xffffffff,uVar2);
      }
      else {
        uVar2 = (uint)sVar4;
        iVar3 = in_ECX + -1;
        if ((iVar3 < 0) || (the_predefined_attr_count <= iVar3)) {
          if (in_ECX == 0x1e) {
            eVar7 = (*(code *)in_RDI[9])
                              (in_RDI,3,
                               "Invalid type enum for \'%s\': the opaque type is not actually a built-in type"
                               ,in_RDX);
          }
          else {
            eVar7 = (*(code *)in_RDI[9])
                              (in_RDI,3,
                               "Invalid type enum for \'%s\' in create by builtin type (type %d)",
                               in_RDX,in_ECX);
          }
        }
        else {
          nattr_00 = (exr_attribute_t *)(the_predefined_attr_typenames + iVar3);
          uVar5 = 0;
          eVar7 = create_attr_block((exr_context_t)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    in_RDI,in_RSI,(int32_t)((ulong)in_RDX >> 0x20),
                                    (uint8_t **)CONCAT44(in_ECX,in_R8D),(char *)in_R9,
                                    in_stack_00000010,in_stack_00000018,(int32_t)nattr);
          if (eVar7 == 0) {
            *puVar6 = in_RDX;
            puVar6[1] = nattr_00->name;
            *(char *)(puVar6 + 2) = (char)uVar2;
            *(char *)((long)puVar6 + 0x11) = (char)*(undefined4 *)&nattr_00->type_name;
            *(undefined4 *)((long)puVar6 + 0x14) = *(undefined4 *)((long)&nattr_00->type_name + 4);
            eVar7 = add_to_list((exr_context_t)CONCAT44(in_ECX,in_R8D),in_R9,nattr_00,
                                (char *)(ulong)uVar2);
          }
          if (eVar7 == 0) {
            *in_stack_00000008 = (long)puVar6;
            check_attr_handler((exr_context_t)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               (exr_attribute_t *)CONCAT44(in_stack_ffffffffffffff9c,uVar5));
          }
          else if (in_R9 != (exr_attribute_list_t *)0x0) {
            in_R9->num_attributes = 0;
            in_R9->num_alloced = 0;
          }
        }
      }
    }
    else if (eVar7 < 0) {
      if (*(int *)(*in_stack_00000008 + 0x14) == in_ECX) {
        eVar7 = 0;
      }
      else {
        lVar1 = *in_stack_00000008;
        *in_stack_00000008 = 0;
        eVar7 = (*(code *)in_RDI[9])
                          (in_RDI,3,"Entry \'%s\' already in list but with different type (\'%s\')",
                           in_RDX,*(undefined8 *)(lVar1 + 8));
      }
    }
  }
  return eVar7;
}

Assistant:

exr_result_t
exr_attr_list_add_static_name (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_type_t  type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    int              rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tidx, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    rval = validate_attr_arguments (ctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if ((*attr)->type != type)
            {
                nattr = *attr;
                *attr = NULL;
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s')",
                    name,
                    nattr->type_name);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    mlen = (int32_t) ctxt->max_name_length;
    slen = strlen (name);
    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    tidx = ((int) type) - 1;
    if (tidx < 0 || tidx >= the_predefined_attr_count)
    {
        if (type == EXR_ATTR_OPAQUE)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid type enum for '%s': the opaque type is not actually a built-in type",
                name);

        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type enum for '%s' in create by builtin type (type %d)",
            name,
            (int) type);
    }
    known = &(the_predefined_attr_typenames[tidx]);

    rval = create_attr_block (
        ctxt, &nattr, known->exp_size, data_len, data_ptr, NULL, 0, NULL, 0);

    if (rval == EXR_ERR_SUCCESS)
    {
        nattr->name             = name;
        nattr->type_name        = known->name;
        nattr->name_length      = (uint8_t) nlen;
        nattr->type_name_length = (uint8_t) known->name_len;
        nattr->type             = known->type;
        rval                    = add_to_list (ctxt, list, nattr, name);
    }

    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (ctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;
    return rval;
}